

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O2

void __thiscall
duckdb_snappy::SnappyIOVecReader::SnappyIOVecReader
          (SnappyIOVecReader *this,iovec *iov,size_t total_size)

{
  size_t sVar1;
  
  (this->super_Source)._vptr_Source = (_func_int **)&PTR__ByteArraySource_027dd1d8;
  this->curr_iov_ = iov;
  if (total_size == 0) {
    this->curr_pos_ = (char *)0x0;
    this->curr_size_remaining_ = 0;
    this->total_size_remaining_ = 0;
    return;
  }
  this->curr_pos_ = (char *)iov->iov_base;
  sVar1 = iov->iov_len;
  this->curr_size_remaining_ = sVar1;
  this->total_size_remaining_ = total_size;
  if (sVar1 != 0) {
    return;
  }
  Advance(this);
  return;
}

Assistant:

SnappyIOVecReader(const struct iovec* iov, size_t total_size)
      : curr_iov_(iov),
        curr_pos_(total_size > 0 ? reinterpret_cast<const char*>(iov->iov_base)
                                 : nullptr),
        curr_size_remaining_(total_size > 0 ? iov->iov_len : 0),
        total_size_remaining_(total_size) {
    // Skip empty leading `iovec`s.
    if (total_size > 0 && curr_size_remaining_ == 0) Advance();
  }